

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

exr_lineorder_t __thiscall Imf_3_3::Context::lineOrder(Context *this,int partidx)

{
  exr_result_t eVar1;
  ostream *poVar2;
  char *pcVar3;
  ArgExc *this_00;
  int in_ESI;
  stringstream _iex_throw_s;
  exr_lineorder_t lo;
  stringstream *in_stack_fffffffffffffe18;
  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffe20;
  exr_const_context_t in_stack_fffffffffffffe28;
  stringstream local_198 [16];
  ostream local_188 [328];
  Context *in_stack_ffffffffffffffc0;
  exr_lineorder_t local_10;
  
  std::__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffffe20);
  eVar1 = exr_get_lineorder(in_stack_fffffffffffffe28,
                            (int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                            (exr_lineorder_t *)in_stack_fffffffffffffe18);
  if (eVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_198);
    poVar2 = std::operator<<(local_188,"Unable to get the line order for part ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_ESI);
    poVar2 = std::operator<<(poVar2," in file \'");
    pcVar3 = fileName(in_stack_ffffffffffffffc0);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"\'");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(this_00,in_stack_fffffffffffffe18);
    __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  return local_10;
}

Assistant:

exr_lineorder_t
Context::lineOrder (int partidx) const
{
    exr_lineorder_t lo;

    if (EXR_ERR_SUCCESS != exr_get_lineorder (*_ctxt, partidx, &lo))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Unable to get the line order for part " << partidx << " in file '"
                                                     << fileName () << "'");
    }

    return lo;
}